

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * ltrim(string *input,string *edible)

{
  ulong in_RDX;
  allocator local_29;
  long local_28;
  size_type start;
  string *edible_local;
  string *input_local;
  
  edible_local = edible;
  input_local = input;
  local_28 = std::__cxx11::string::find_first_not_of((string *)edible,in_RDX);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)input,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::substr((ulong)input,(ulong)edible_local);
  }
  return input;
}

Assistant:

std::string ltrim (const std::string& input, const std::string& edible)
{
  auto start = input.find_first_not_of (edible);
  if (start == std::string::npos)
    return "";

  return input.substr (start);
}